

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finders.c
# Opt level: O3

void extendFortress(PieceEnv *env,Piece *p,int offh,int offv,int turn,int corridor)

{
  int depth;
  byte bVar1;
  uint64_t *puVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  Piece *pPVar6;
  int y;
  ulong uVar7;
  int iVar8;
  int *piVar9;
  int *piVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  uint64_t uVar19;
  int local_70;
  
  bVar1 = p->rot;
  uVar17 = 1;
  if (corridor != 0) {
    uVar17 = 7;
  }
  uVar7 = 0xe;
  if (corridor == 0) {
    uVar7 = 7;
  }
  if (turn == -1) {
    iVar11 = (p->bb0).x;
    iVar8 = (p->bb0).z;
    if ((bVar1 & 1) == 0) {
      iVar11 = iVar11 + -1;
      iVar8 = iVar8 + offh;
      local_70 = 3;
    }
    else {
      iVar11 = offh + iVar11;
      iVar8 = iVar8 + -1;
      local_70 = 0;
    }
  }
  else {
    if (turn == 0) {
      (*(code *)(&DAT_0012c5b4 + *(int *)(&DAT_0012c5b4 + (ulong)bVar1 * 4)))
                (&DAT_0012c5b4 + *(int *)(&DAT_0012c5b4 + (ulong)bVar1 * 4));
      return;
    }
    if ((bVar1 & 1) == 0) {
      iVar8 = offh + (p->bb0).z;
      iVar11 = (p->bb1).x + 1;
      local_70 = 1;
    }
    else {
      iVar11 = offh + (p->bb0).x;
      iVar8 = (p->bb1).z + 1;
      local_70 = 2;
    }
  }
  depth = p->depth + 1;
  y = offv + (p->bb0).y;
  uVar12 = iVar11 - (env->list->bb0).x;
  uVar16 = -uVar12;
  if (0 < (int)uVar12) {
    uVar16 = uVar12;
  }
  uVar12 = 0xffffffff;
  if (uVar16 < 0x71) {
    uVar13 = iVar8 - (env->list->bb0).z;
    uVar16 = -uVar13;
    if (0 < (int)uVar13) {
      uVar16 = uVar13;
    }
    if (uVar16 < 0x71) {
      uVar14 = (ulong)uVar17;
      piVar10 = (int *)((long)&fortress_info[0].max + (ulong)(uVar17 * 0x30));
      uVar16 = 0;
      bVar3 = false;
      uVar15 = uVar14;
      do {
        bVar4 = bVar3;
        if ((*piVar10 < 1) || (bVar4 = true, env->ntyp[uVar15] < *piVar10)) {
          bVar3 = bVar4;
          uVar16 = uVar16 + piVar10[-1];
        }
        uVar12 = 0;
        uVar15 = uVar15 + 1;
        piVar10 = piVar10 + 0xc;
      } while (uVar15 < uVar7);
      if (p->depth < '\x1e' && (0 < (int)uVar16 && bVar3)) {
        uVar12 = uVar16 - (uVar16 >> 1 & 0x55555555);
        uVar13 = (uVar12 >> 2 & 0x33333333) + (uVar12 & 0x33333333);
        piVar10 = (int *)((long)&fortress_info[0].max + (ulong)(uVar17 * 0x30));
        iVar5 = 0;
        do {
          puVar2 = env->rng;
          uVar19 = *puVar2;
          piVar9 = piVar10;
          uVar15 = uVar14;
          if (((uVar13 >> 4) + uVar13 & 0xf0f0f0f) * 0x1010101 >> 0x18 < 2) {
            uVar18 = uVar19 * 0x5deece66d + 0xb & 0xffffffffffff;
            *puVar2 = uVar18;
            uVar18 = (uVar18 >> 0x11) * (ulong)uVar16 >> 0x1f;
          }
          else {
            do {
              uVar19 = uVar19 * 0x5deece66d + 0xb & 0xffffffffffff;
              uVar18 = (uVar19 >> 0x11) % (ulong)uVar16;
            } while (-1 < (int)((int)uVar18 - ((int)(uVar19 >> 0x11) + uVar16)));
            *puVar2 = uVar19;
          }
          do {
            if (((*piVar9 < 1) || (env->ntyp[uVar15] < *piVar9)) &&
               (uVar17 = (int)uVar18 - piVar9[-1], uVar18 = (ulong)uVar17, (int)uVar17 < 0)) {
              if ((uVar15 == (uint)env->typlast) && (piVar9[-2] == 0)) break;
              pPVar6 = addFortressPiece(env,(int)uVar15,iVar11,y,iVar8,depth,local_70,1);
              if (pPVar6 != (Piece *)0x0) {
                return;
              }
            }
            uVar15 = uVar15 + 1;
            piVar9 = piVar9 + 0xc;
          } while (uVar15 < uVar7);
          iVar5 = iVar5 + 1;
          uVar12 = 0;
        } while (iVar5 != 5);
      }
    }
  }
  addFortressPiece(env,0xe,iVar11,y,iVar8,depth,local_70,~uVar12 >> 0x1f);
  return;
}

Assistant:

static
void extendFortress(PieceEnv *env, Piece *p, int offh, int offv, int turn, int corridor)
{
    int x, y, z, t, i;
    int depth = p->depth + 1;
    int facing = p->rot;
    int typ0 = corridor ? CORRIDOR_STRAIGHT : BRIDGE_STRAIGHT;
    int typ1 = typ0 + (corridor ? 7 : 6);
    int valid = -1;
    int weight_tot = 0;

    y = p->bb0.y + offv;

    if (turn == 0) { // forward
        switch (facing) {
        case 0: x = p->bb0.x+offh; z = p->bb0.z-1;    break;
        case 1: x = p->bb1.x+1;    z = p->bb0.z+offh; break;
        case 2: x = p->bb0.x+offh; z = p->bb1.z+1;    break;
        case 3: x = p->bb0.x-1;    z = p->bb0.z+offh; break;
        default: UNREACHABLE();
        }
    } else if (turn == -1) { // left
        if (facing & 1) { x = p->bb0.x+offh; z = p->bb0.z-1;    facing = 0; }
        else            { x = p->bb0.x-1;    z = p->bb0.z+offh; facing = 3; }
    } else if (turn == +1) { // right
        if (facing & 1) { x = p->bb0.x+offh, z = p->bb1.z+1;    facing = 2; }
        else            { x = p->bb1.x+1;    z = p->bb0.z+offh; facing = 1; }
    } else UNREACHABLE();

    if (IABS(x - env->list->bb0.x) > 112 || IABS(z - env->list->bb0.z) > 112)
        goto L_end;

    for (valid = 0, t = typ0; t < typ1; t++)
    {
        int max = fortress_info[t].max;
        if (max > 0 && env->ntyp[t] >= max)
            continue;
        if (max > 0)
            valid = 1;
        weight_tot += fortress_info[t].weight;
    }

    if (valid == 0 || weight_tot <= 0 || depth > 30)
        goto L_end;

    for (i = 0; i < 5; i++)
    {
        int n = nextInt(env->rng, weight_tot);
        for (t = typ0; t < typ1; t++)
        {
            int max = fortress_info[t].max;
            if (max > 0 && env->ntyp[t] >= max)
                continue;
            n -= fortress_info[t].weight;
            if (n >= 0)
                continue;
            if (env->typlast == t && !fortress_info[t].repeatable)
                break;
            if (addFortressPiece(env, t, x, y, z, depth, facing, 1) != NULL)
                return;
        }
    }

L_end:
    addFortressPiece(env, FORTRESS_END, x, y, z, depth, facing, valid >= 0);
}